

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  uv_loop_t *loop;
  cmCTestTestHandler *pcVar1;
  int iVar2;
  
  CheckResume(this);
  if (this->HasCycles != false) {
    return;
  }
  pcVar1 = this->TestHandler;
  iVar2 = FindMaxIndex(this);
  pcVar1->MaxIndex = iVar2;
  loop = &this->Loop;
  uv_loop_init(loop);
  StartNextTests(this);
  uv_run(loop,UV_RUN_DEFAULT);
  uv_loop_close(loop);
  MarkFinished(this);
  UpdateCostData(this);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if (this->HasCycles) {
    return;
  }
#ifdef CMAKE_UV_SIGNAL_HACK
  cmUVSignalHackRAII hackRAII;
#endif
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  uv_loop_init(&this->Loop);
  this->StartNextTests();
  uv_run(&this->Loop, UV_RUN_DEFAULT);
  uv_loop_close(&this->Loop);

  this->MarkFinished();
  this->UpdateCostData();
}